

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void freeP4(sqlite3 *db,int p4type,void *p4)

{
  void *p;
  VdbeFunc *pVdbeFunc;
  
  if (p4 == (void *)0x0) {
    return;
  }
  switch(p4type) {
  case -0x10:
  case -0xf:
  case -0xd:
  case -0xc:
  case -6:
  case -1:
    break;
  default:
    return;
  case -0xb:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3_free(p4);
      return;
    }
    return;
  case -10:
    if (db->pnBytesFreed != (int *)0x0) {
      return;
    }
    sqlite3VtabUnlock((VTable *)p4);
    return;
  case -8:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3ValueFree((sqlite3_value *)p4);
      return;
    }
    sqlite3DbFree(db,*(void **)((long)p4 + 0x30));
    break;
  case -7:
    p = *p4;
    if ((p != (void *)0x0) && ((*(byte *)((long)p + 3) & 4) != 0)) {
      sqlite3DbFree(db,p);
    }
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3VdbeDeleteAuxData((VdbeFunc *)p4,0);
    }
    break;
  case -5:
    if ((*(byte *)((long)p4 + 3) & 4) == 0) {
      return;
    }
  }
  sqlite3DbFree(db,p4);
  return;
}

Assistant:

static void freeP4(sqlite3 *db, int p4type, void *p4){
  if( p4 ){
    assert( db );
    switch( p4type ){
      case P4_REAL:
      case P4_INT64:
      case P4_DYNAMIC:
      case P4_KEYINFO:
      case P4_INTARRAY:
      case P4_KEYINFO_HANDOFF: {
        sqlite3DbFree(db, p4);
        break;
      }
      case P4_MPRINTF: {
        if( db->pnBytesFreed==0 ) sqlite3_free(p4);
        break;
      }
      case P4_VDBEFUNC: {
        VdbeFunc *pVdbeFunc = (VdbeFunc *)p4;
        freeEphemeralFunction(db, pVdbeFunc->pFunc);
        if( db->pnBytesFreed==0 ) sqlite3VdbeDeleteAuxData(pVdbeFunc, 0);
        sqlite3DbFree(db, pVdbeFunc);
        break;
      }
      case P4_FUNCDEF: {
        freeEphemeralFunction(db, (FuncDef*)p4);
        break;
      }
      case P4_MEM: {
        if( db->pnBytesFreed==0 ){
          sqlite3ValueFree((sqlite3_value*)p4);
        }else{
          Mem *p = (Mem*)p4;
          sqlite3DbFree(db, p->zMalloc);
          sqlite3DbFree(db, p);
        }
        break;
      }
      case P4_VTAB : {
        if( db->pnBytesFreed==0 ) sqlite3VtabUnlock((VTable *)p4);
        break;
      }
    }
  }
}